

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_FabArrayBase.cpp
# Opt level: O3

CFinfo * amrex::FabArrayBase::TheCFinfo
                   (FabArrayBase *finefa,Geometry *finegm,IntVect *ng,bool include_periodic,
                   bool include_physbndry)

{
  int *piVar1;
  _Base_ptr p_Var2;
  undefined8 uVar3;
  undefined8 uVar4;
  bool bVar5;
  int idim;
  int iVar6;
  long lVar7;
  _Rb_tree_iterator<std::pair<const_amrex::FabArrayBase::BDKey,_amrex::FabArrayBase::CFinfo_*>_>
  _Var8;
  CFinfo *pCVar9;
  _Rb_tree_iterator<std::pair<const_amrex::FabArrayBase::BDKey,_amrex::FabArrayBase::CFinfo_*>_>
  _Var10;
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  pair<std::_Rb_tree_iterator<std::pair<const_amrex::FabArrayBase::BDKey,_amrex::FabArrayBase::CFinfo_*>_>,_std::_Rb_tree_iterator<std::pair<const_amrex::FabArrayBase::BDKey,_amrex::FabArrayBase::CFinfo_*>_>_>
  pVar14;
  Box bx;
  _Alloc_node __an;
  _Rb_tree_iterator<std::pair<const_amrex::FabArrayBase::BDKey,_amrex::FabArrayBase::CFinfo_*>_>
  local_80;
  Box local_68;
  key_type local_48;
  _Alloc_node local_38;
  
  local_48.m_ba_id.data =
       (finefa->boxarray).m_ref.super___shared_ptr<amrex::BARef,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  local_48.m_dm_id.data =
       (finefa->distributionMap).m_ref.
       super___shared_ptr<amrex::DistributionMapping::Ref,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  pVar14 = std::
           _Rb_tree<amrex::FabArrayBase::BDKey,_std::pair<const_amrex::FabArrayBase::BDKey,_amrex::FabArrayBase::CFinfo_*>,_std::_Select1st<std::pair<const_amrex::FabArrayBase::BDKey,_amrex::FabArrayBase::CFinfo_*>_>,_std::less<amrex::FabArrayBase::BDKey>,_std::allocator<std::pair<const_amrex::FabArrayBase::BDKey,_amrex::FabArrayBase::CFinfo_*>_>_>
           ::equal_range((_Rb_tree<amrex::FabArrayBase::BDKey,_std::pair<const_amrex::FabArrayBase::BDKey,_amrex::FabArrayBase::CFinfo_*>,_std::_Select1st<std::pair<const_amrex::FabArrayBase::BDKey,_amrex::FabArrayBase::CFinfo_*>_>,_std::less<amrex::FabArrayBase::BDKey>,_std::allocator<std::pair<const_amrex::FabArrayBase::BDKey,_amrex::FabArrayBase::CFinfo_*>_>_>
                          *)m_TheCrseFineCache,&local_48);
  local_80 = pVar14.second._M_node;
  if (pVar14.first._M_node._M_node != local_80._M_node) {
    _Var8._M_node = (_Base_ptr)&finegm->domain;
    do {
      local_80 = pVar14.second._M_node;
      _Var10 = pVar14.first._M_node;
      p_Var2 = _Var10._M_node[1]._M_left;
      auVar11._0_4_ = -(uint)(*(int *)&p_Var2[4]._M_left == (int)local_48.m_ba_id.data);
      auVar11._4_4_ = -(uint)(*(int *)((long)&p_Var2[4]._M_left + 4) == local_48.m_ba_id.data._4_4_)
      ;
      auVar11._8_4_ = -(uint)(*(int *)&p_Var2[4]._M_right == (int)local_48.m_dm_id.data);
      auVar11._12_4_ =
           -(uint)(*(int *)((long)&p_Var2[4]._M_right + 4) == local_48.m_dm_id.data._4_4_);
      auVar12._4_4_ = auVar11._0_4_;
      auVar12._0_4_ = auVar11._4_4_;
      auVar12._8_4_ = auVar11._12_4_;
      auVar12._12_4_ = auVar11._8_4_;
      iVar6 = movmskpd((int)_Var8._M_node,auVar12 & auVar11);
      if (iVar6 == 3) {
        uVar3 = *(undefined8 *)((finegm->domain).smallend.vect + 2);
        uVar4 = *(undefined8 *)((finegm->domain).bigend.vect + 2);
        local_68.bigend.vect[1] = (int)((ulong)*(undefined8 *)(finegm->domain).bigend.vect >> 0x20);
        local_68.bigend.vect[2] = (int)uVar4;
        local_68.btype.itype = (uint)((ulong)uVar4 >> 0x20);
        local_68.smallend.vect._0_8_ = *(undefined8 *)(finegm->domain).smallend.vect;
        local_68.smallend.vect[2] = (int)uVar3;
        local_68.bigend.vect[0] = (int)((ulong)uVar3 >> 0x20);
        lVar7 = 0;
        do {
          if (*(char *)((long)(finegm->super_CoordSys).inv_dx + lVar7 + 0x19) == '\x01') {
            if (include_periodic) {
LAB_00477685:
              iVar6 = ng->vect[lVar7];
              piVar1 = local_68.smallend.vect + lVar7;
              *piVar1 = *piVar1 - iVar6;
              piVar1 = local_68.bigend.vect + lVar7;
              *piVar1 = *piVar1 + iVar6;
            }
          }
          else if (include_physbndry) goto LAB_00477685;
          lVar7 = lVar7 + 1;
        } while (lVar7 != 3);
        bVar5 = Box::operator==((Box *)(p_Var2 + 5),&local_68);
        if ((((bVar5) &&
             (pCVar9 = (CFinfo *)_Var10._M_node[1]._M_left, (pCVar9->m_ng).vect[0] == ng->vect[0]))
            && ((pCVar9->m_ng).vect[1] == ng->vect[1])) && ((pCVar9->m_ng).vect[2] == ng->vect[2]))
        {
          pCVar9->m_nuse = pCVar9->m_nuse + 1;
          _DAT_0071afc0 = _DAT_0071afc0 + 1;
          return pCVar9;
        }
      }
      _Var8._M_node = (_Base_ptr)std::_Rb_tree_increment(_Var10._M_node);
      pVar14.second._M_node = local_80._M_node;
      pVar14.first._M_node = _Var8._M_node;
    } while (_Var8._M_node != local_80._M_node);
  }
  pCVar9 = (CFinfo *)operator_new(0xd8);
  CFinfo::CFinfo(pCVar9,finefa,finegm,ng,include_periodic,include_physbndry);
  iVar6 = m_CFinfo_stats + 1;
  if (m_CFinfo_stats < DAT_0071afb4) {
    iVar6 = DAT_0071afb4;
  }
  m_CFinfo_stats = m_CFinfo_stats + 1;
  pCVar9->m_nuse = 1;
  auVar13._8_4_ = 0xffffffff;
  auVar13._0_8_ = 0xffffffffffffffff;
  auVar13._12_4_ = 0xffffffff;
  _DAT_0071afc0 = _DAT_0071afc0 + 1;
  lRam000000000071afc8 = lRam000000000071afc8 - auVar13._8_8_;
  local_68.smallend.vect._0_8_ = local_48.m_ba_id.data;
  local_68.smallend.vect[2] = (int)local_48.m_dm_id.data;
  local_68.bigend.vect[0] = (int)((ulong)local_48.m_dm_id.data >> 0x20);
  local_68.bigend.vect[1] = (int)pCVar9;
  local_68.bigend.vect[2] = (int)((ulong)pCVar9 >> 0x20);
  local_38._M_t =
       (_Rb_tree<amrex::FabArrayBase::BDKey,_std::pair<const_amrex::FabArrayBase::BDKey,_amrex::FabArrayBase::CFinfo_*>,_std::_Select1st<std::pair<const_amrex::FabArrayBase::BDKey,_amrex::FabArrayBase::CFinfo_*>_>,_std::less<amrex::FabArrayBase::BDKey>,_std::allocator<std::pair<const_amrex::FabArrayBase::BDKey,_amrex::FabArrayBase::CFinfo_*>_>_>
        *)m_TheCrseFineCache;
  DAT_0071afb4 = iVar6;
  std::
  _Rb_tree<amrex::FabArrayBase::BDKey,std::pair<amrex::FabArrayBase::BDKey_const,amrex::FabArrayBase::CFinfo*>,std::_Select1st<std::pair<amrex::FabArrayBase::BDKey_const,amrex::FabArrayBase::CFinfo*>>,std::less<amrex::FabArrayBase::BDKey>,std::allocator<std::pair<amrex::FabArrayBase::BDKey_const,amrex::FabArrayBase::CFinfo*>>>
  ::
  _M_insert_equal_<std::pair<amrex::FabArrayBase::BDKey_const,amrex::FabArrayBase::CFinfo*>,std::_Rb_tree<amrex::FabArrayBase::BDKey,std::pair<amrex::FabArrayBase::BDKey_const,amrex::FabArrayBase::CFinfo*>,std::_Select1st<std::pair<amrex::FabArrayBase::BDKey_const,amrex::FabArrayBase::CFinfo*>>,std::less<amrex::FabArrayBase::BDKey>,std::allocator<std::pair<amrex::FabArrayBase::BDKey_const,amrex::FabArrayBase::CFinfo*>>>::_Alloc_node>
            ((_Rb_tree<amrex::FabArrayBase::BDKey,std::pair<amrex::FabArrayBase::BDKey_const,amrex::FabArrayBase::CFinfo*>,std::_Select1st<std::pair<amrex::FabArrayBase::BDKey_const,amrex::FabArrayBase::CFinfo*>>,std::less<amrex::FabArrayBase::BDKey>,std::allocator<std::pair<amrex::FabArrayBase::BDKey_const,amrex::FabArrayBase::CFinfo*>>>
              *)m_TheCrseFineCache,(const_iterator)local_80._M_node,
             (pair<const_amrex::FabArrayBase::BDKey,_amrex::FabArrayBase::CFinfo_*> *)&local_68,
             &local_38);
  return pCVar9;
}

Assistant:

const FabArrayBase::CFinfo&
FabArrayBase::TheCFinfo (const FabArrayBase& finefa,
                         const Geometry&     finegm,
                         const IntVect&      ng,
                         bool                include_periodic,
                         bool                include_physbndry)
{
    BL_PROFILE("FabArrayBase::TheCFinfo()");

    const BDKey& key = finefa.getBDKey();
    auto er_it = m_TheCrseFineCache.equal_range(key);
    for (auto it = er_it.first; it != er_it.second; ++it)
    {
        if (it->second->m_fine_bdk    == key                        &&
            it->second->m_fine_domain == CFinfo::Domain(finegm, ng,
                                                        include_periodic,
                                                        include_physbndry) &&
            it->second->m_ng          == ng)
        {
            ++(it->second->m_nuse);
            m_CFinfo_stats.recordUse();
            return *(it->second);
        }
    }

    // Have to build a new one
    CFinfo* new_cfinfo = new CFinfo(finefa, finegm, ng, include_periodic, include_physbndry);

#ifdef AMREX_MEM_PROFILING
    m_CFinfo_stats.bytes += new_cfinfo->bytes();
    m_CFinfo_stats.bytes_hwm = std::max(m_CFinfo_stats.bytes_hwm, m_CFinfo_stats.bytes);
#endif

    new_cfinfo->m_nuse = 1;
    m_CFinfo_stats.recordBuild();
    m_CFinfo_stats.recordUse();

    m_TheCrseFineCache.insert(er_it.second, CFinfoCache::value_type(key,new_cfinfo));

    return *new_cfinfo;
}